

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O0

int32 read_classdef_file(hash_table_t *classes,char *file_name)

{
  bool bVar1;
  int iVar2;
  int32 iVar3;
  char *pcVar4;
  classdef_t *classdef_00;
  char **ppcVar5;
  float32 *pfVar6;
  classdef_t *pcVar7;
  double dVar8;
  float32 local_290;
  int local_28c;
  float32 fprob;
  int32 i;
  gnode_t *weight;
  gnode_t *word;
  classdef_t *classdef;
  char *pcStack_268;
  int n_words;
  char *wptr [2];
  char line [512];
  char *classname;
  glist_t classprobs;
  glist_t classwords;
  gnode_t *gn;
  int32 rv;
  int inclass;
  int32 is_pipe;
  FILE *fp;
  char *file_name_local;
  hash_table_t *classes_local;
  
  gn._4_4_ = -1;
  classprobs = (glist_t)0x0;
  classname = (char *)0x0;
  line[0x1f8] = '\0';
  line[0x1f9] = '\0';
  line[0x1fa] = '\0';
  line[0x1fb] = '\0';
  line[0x1fc] = '\0';
  line[0x1fd] = '\0';
  line[0x1fe] = '\0';
  line[0x1ff] = '\0';
  fp = (FILE *)file_name;
  file_name_local = (char *)classes;
  _inclass = (FILE *)fopen_comp(file_name,"r",&rv);
  if (_inclass == (FILE *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
            ,0x394,"File %s not found\n",fp);
    classes_local._4_4_ = -1;
  }
  else {
    bVar1 = false;
    while ((iVar2 = feof(_inclass), iVar2 == 0 &&
           (pcVar4 = fgets((char *)(wptr + 1),0x200,_inclass), pcVar4 != (char *)0x0))) {
      iVar3 = str2words((char *)(wptr + 1),&stack0xfffffffffffffd98,2);
      if (0 < iVar3) {
        if (bVar1) {
          if ((iVar3 == 2) && (iVar2 = strcmp(pcStack_268,"END"), iVar2 == 0)) {
            if ((line._504_8_ == 0) || (iVar2 = strcmp(wptr[0],(char *)line._504_8_), iVar2 != 0))
            goto LAB_00106e0e;
            bVar1 = false;
            classdef_00 = (classdef_t *)
                          __ckd_calloc__(1,0x18,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                                         ,0x3b1);
            classprobs = glist_reverse(classprobs);
            classname = (char *)glist_reverse((glist_t)classname);
            iVar3 = glist_count(classprobs);
            classdef_00->n_words = iVar3;
            ppcVar5 = (char **)__ckd_calloc__((long)classdef_00->n_words,8,
                                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                                              ,0x3b6);
            classdef_00->words = ppcVar5;
            pfVar6 = (float32 *)
                     __ckd_calloc__((long)classdef_00->n_words,4,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                                    ,0x3b8);
            classdef_00->weights = pfVar6;
            _fprob = (gnode_s *)classname;
            weight = classprobs;
            for (local_28c = 0; local_28c < classdef_00->n_words; local_28c = local_28c + 1) {
              *(anytype_t *)(classdef_00->words + local_28c) = weight->data;
              classdef_00->weights[local_28c] = (float32)(float)(_fprob->data).fl;
              weight = weight->next;
              _fprob = _fprob->next;
            }
            pcVar7 = (classdef_t *)
                     hash_table_enter((hash_table_t *)file_name_local,(char *)line._504_8_,
                                      classdef_00);
            if (pcVar7 != classdef_00) {
              classdef_free(classdef_00);
              goto LAB_00106e0e;
            }
            glist_free(classprobs);
            glist_free((glist_t)classname);
            classprobs = (glist_t)0x0;
            classname = (char *)0x0;
            line[0x1f8] = '\0';
            line[0x1f9] = '\0';
            line[0x1fa] = '\0';
            line[0x1fb] = '\0';
            line[0x1fc] = '\0';
            line[0x1fd] = '\0';
            line[0x1fe] = '\0';
            line[0x1ff] = '\0';
          }
          else {
            if (iVar3 == 2) {
              dVar8 = atof_c(wptr[0]);
              local_290 = (float32)(float)dVar8;
            }
            else {
              local_290 = 1.0;
            }
            pcVar4 = __ckd_salloc__(pcStack_268,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                                    ,0x3d9);
            classprobs = glist_add_ptr(classprobs,pcVar4);
            classname = (char *)glist_add_float32((glist_t)classname,local_290);
          }
        }
        else if ((iVar3 == 2) && (iVar2 = strcmp(pcStack_268,"LMCLASS"), iVar2 == 0)) {
          bVar1 = true;
          line._504_8_ = __ckd_salloc__(wptr[0],
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                                        ,0x3e3);
        }
      }
    }
    gn._4_4_ = 0;
LAB_00106e0e:
    fclose_comp((FILE *)_inclass,rv);
    for (classwords = classprobs; classwords != (glist_t)0x0; classwords = classwords->next) {
      ckd_free((classwords->data).ptr);
    }
    glist_free(classprobs);
    glist_free((glist_t)classname);
    ckd_free((void *)line._504_8_);
    classes_local._4_4_ = gn._4_4_;
  }
  return classes_local._4_4_;
}

Assistant:

int32
read_classdef_file(hash_table_t * classes, const char *file_name)
{
    FILE *fp;
    int32 is_pipe;
    int inclass;  /**< Are we currently reading a list of class words? */
    int32 rv = -1;
    gnode_t *gn;
    glist_t classwords = NULL;
    glist_t classprobs = NULL;
    char *classname = NULL;

    if ((fp = fopen_comp(file_name, "r", &is_pipe)) == NULL) {
        E_ERROR("File %s not found\n", file_name);
        return -1;
    }

    inclass = FALSE;
    while (!feof(fp)) {
        char line[512];
        char *wptr[2];
        int n_words;

        if (fgets(line, sizeof(line), fp) == NULL)
            break;

        n_words = str2words(line, wptr, 2);
        if (n_words <= 0)
            continue;

        if (inclass) {
            /* Look for an end of class marker. */
            if (n_words == 2 && 0 == strcmp(wptr[0], "END")) {
                classdef_t *classdef;
                gnode_t *word, *weight;
                int32 i;

                if (classname == NULL || 0 != strcmp(wptr[1], classname))
                    goto error_out;
                inclass = FALSE;

                /* Construct a class from the list of words collected. */
                classdef = ckd_calloc(1, sizeof(*classdef));
                classwords = glist_reverse(classwords);
                classprobs = glist_reverse(classprobs);
                classdef->n_words = glist_count(classwords);
                classdef->words = ckd_calloc(classdef->n_words,
                                             sizeof(*classdef->words));
                classdef->weights = ckd_calloc(classdef->n_words,
                                               sizeof(*classdef->weights));
                word = classwords;
                weight = classprobs;
                for (i = 0; i < classdef->n_words; ++i) {
                    classdef->words[i] = gnode_ptr(word);
                    classdef->weights[i] = gnode_float32(weight);
                    word = gnode_next(word);
                    weight = gnode_next(weight);
                }

                /* Add this class to the hash table. */
                if (hash_table_enter(classes, classname, classdef) !=
                    classdef) {
                    classdef_free(classdef);
                    goto error_out;
                }

                /* Reset everything. */
                glist_free(classwords);
                glist_free(classprobs);
                classwords = NULL;
                classprobs = NULL;
                classname = NULL;
            }
            else {
                float32 fprob;

                if (n_words == 2)
                    fprob = atof_c(wptr[1]);
                else
                    fprob = 1.0f;
                /* Add it to the list of words for this class. */
                classwords =
                    glist_add_ptr(classwords, ckd_salloc(wptr[0]));
                classprobs = glist_add_float32(classprobs, fprob);
            }
        }
        else {
            /* Start a new LM class if the LMCLASS marker is seen */
            if (n_words == 2 && 0 == strcmp(wptr[0], "LMCLASS")) {
                if (inclass)
                    goto error_out;
                inclass = TRUE;
                classname = ckd_salloc(wptr[1]);
            }
            /* Otherwise, just ignore whatever junk we got */
        }
    }
    rv = 0;                     /* Success. */

  error_out:
    /* Free all the stuff we might have allocated. */
    fclose_comp(fp, is_pipe);
    for (gn = classwords; gn; gn = gnode_next(gn))
        ckd_free(gnode_ptr(gn));
    glist_free(classwords);
    glist_free(classprobs);
    ckd_free(classname);

    return rv;
}